

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xr_mesh_builder.cxx
# Opt level: O0

bool __thiscall
xray_re::xr_mesh_builder::b_face::is_back
          (b_face *this,b_face *face,
          vector<xray_re::_vector3<float>,_std::allocator<xray_re::_vector3<float>_>_> *normals,
          float normal_tolerance)

{
  bool bVar1;
  const_reference pvVar2;
  const_reference pvVar3;
  uint uVar4;
  long lVar5;
  long lVar6;
  bool local_51;
  uint_fast32_t i2;
  uint_fast32_t i1;
  uint_fast32_t i0;
  float normal_tolerance_local;
  vector<xray_re::_vector3<float>,_std::allocator<xray_re::_vector3<float>_>_> *normals_local;
  b_face *face_local;
  b_face *this_local;
  
  i1 = 0;
  while( true ) {
    if (i1 == 3) {
      return false;
    }
    if ((this->field_0).__refs[i1] == (face->field_0).field_0.v[0]) break;
    i1 = i1 + 1;
  }
  uVar4 = 1 << ((byte)i1 & 0x1f) & 3;
  lVar5 = (long)(int)uVar4;
  lVar6 = (long)(int)(1 << (sbyte)uVar4 & 3);
  local_51 = false;
  if ((((this->field_0).__refs[lVar5] == (face->field_0).field_0.v[2]) &&
      (local_51 = false, (this->field_0).__refs[lVar6] == (face->field_0).field_0.v[1])) &&
     (local_51 = false, this->sector == face->sector)) {
    bVar1 = xr_raw_surface::operator==(&(this->field_1).surface,&(face->field_1).surface);
    local_51 = false;
    if (((bVar1) &&
        (local_51 = false,
        *(uint32_t *)((long)&this->field_0 + i1 * 4 + 0x18) == (face->field_0).field_0.tc[0])) &&
       ((local_51 = false,
        *(uint32_t *)((long)&this->field_0 + lVar5 * 4 + 0x18) == (face->field_0).field_0.tc[2] &&
        (local_51 = false,
        *(uint32_t *)((long)&this->field_0 + lVar6 * 4 + 0x18) == (face->field_0).field_0.tc[1]))))
    {
      pvVar2 = std::vector<xray_re::_vector3<float>,_std::allocator<xray_re::_vector3<float>_>_>::
               operator[](normals,(ulong)*(uint *)((long)&this->field_0 + i1 * 4 + 0xc));
      pvVar3 = std::vector<xray_re::_vector3<float>,_std::allocator<xray_re::_vector3<float>_>_>::
               operator[](normals,(ulong)(face->field_0).field_0.n[0]);
      bVar1 = _vector3<float>::inverted(pvVar2,pvVar3,normal_tolerance);
      local_51 = false;
      if (bVar1) {
        pvVar2 = std::vector<xray_re::_vector3<float>,_std::allocator<xray_re::_vector3<float>_>_>::
                 operator[](normals,(ulong)*(uint *)((long)&this->field_0 + lVar5 * 4 + 0xc));
        pvVar3 = std::vector<xray_re::_vector3<float>,_std::allocator<xray_re::_vector3<float>_>_>::
                 operator[](normals,(ulong)(face->field_0).field_0.n[2]);
        bVar1 = _vector3<float>::inverted(pvVar2,pvVar3,normal_tolerance);
        local_51 = false;
        if (bVar1) {
          pvVar2 = std::vector<xray_re::_vector3<float>,_std::allocator<xray_re::_vector3<float>_>_>
                   ::operator[](normals,(ulong)*(uint *)((long)&this->field_0 + lVar6 * 4 + 0xc));
          pvVar3 = std::vector<xray_re::_vector3<float>,_std::allocator<xray_re::_vector3<float>_>_>
                   ::operator[](normals,(ulong)(face->field_0).field_0.n[1]);
          local_51 = _vector3<float>::inverted(pvVar2,pvVar3,normal_tolerance);
        }
      }
    }
  }
  return local_51;
}

Assistant:

bool xr_mesh_builder::b_face::is_back(const b_face& face,
		const std::vector<fvector3>& normals, float normal_tolerance) const
{
	for (uint_fast32_t i0 = 0; i0 != 3; ++i0) {
		if (v[i0] != face.v0)
			continue;
		uint_fast32_t i1 = (1 << i0) & 3;
		uint_fast32_t i2 = (1 << i1) & 3;
		return v[i1] == face.v2 && v[i2] == face.v1 &&
				sector == face.sector && surface == face.surface &&
				tc[i0] == face.tc0 && tc[i1] == face.tc2 && tc[i2] == face.tc1 &&
				normals[n[i0]].inverted(normals[face.n0], normal_tolerance) &&
				normals[n[i1]].inverted(normals[face.n2], normal_tolerance) &&
				normals[n[i2]].inverted(normals[face.n1], normal_tolerance);
	}
	return false;
}